

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

int katherine_set_dacs(katherine_device_t *device,katherine_dacs_t *dacs)

{
  int iVar1;
  char local_30 [4];
  char local_2c;
  undefined1 local_2a;
  char cmd [8];
  int i;
  int res;
  katherine_dacs_t *dacs_local;
  katherine_device_t *device_local;
  
  cmd._4_4_ = katherine_udp_mutex_lock(&device->control_socket);
  if (cmd._4_4_ == 0) {
    cmd[0] = '\0';
    cmd[1] = '\0';
    cmd[2] = '\0';
    cmd[3] = '\0';
    for (; cmd[4] = '\0', cmd[5] = '\0', cmd[6] = '\0', cmd[7] = '\0', (int)cmd._0_4_ < 0x12;
        cmd._0_4_ = cmd._0_4_ + 1) {
      memset(local_30,0,8);
      local_2a = 4;
      local_2c = (char)cmd._0_4_;
      katherine_cmd_long(local_30,(ulong)dacs->array[(int)cmd._0_4_]);
      cmd._4_4_ = katherine_cmd(&device->control_socket,local_30,8);
      if ((cmd._4_4_ != 0) ||
         (cmd._4_4_ = katherine_cmd_wait_ack(&device->control_socket), cmd._4_4_ != 0))
      goto LAB_0010569d;
    }
    cmd._4_4_ = katherine_cmd_hw_internal_dac_update(&device->control_socket);
    if ((cmd._4_4_ == 0) &&
       (cmd._4_4_ = katherine_cmd_wait_ack(&device->control_socket), cmd._4_4_ == 0)) {
      katherine_udp_mutex_unlock(&device->control_socket);
      return 0;
    }
  }
LAB_0010569d:
  katherine_udp_mutex_unlock(&device->control_socket);
  iVar1._0_1_ = cmd[4];
  iVar1._1_1_ = cmd[5];
  iVar1._2_1_ = cmd[6];
  iVar1._3_1_ = cmd[7];
  return iVar1;
}

Assistant:

int
katherine_set_dacs(katherine_device_t *device, const katherine_dacs_t *dacs)
{
    int res;

    res = katherine_udp_mutex_lock(&device->control_socket);
    if (res) goto err;

    for (int i = 0; i < 18; ++i) {
        char cmd[8] = {0};
        cmd[6] = CMD_TYPE_INTERNAL_DAC_SETTINGS;
        cmd[4] = (char) i;
        katherine_cmd_long(cmd, dacs->array[i]);

        res = katherine_cmd(&device->control_socket, &cmd, sizeof(cmd));
        if (res) goto err;

        res = katherine_cmd_wait_ack(&device->control_socket);
        if (res) goto err;
    }

    res = katherine_cmd_hw_internal_dac_update(&device->control_socket);
    if (res) goto err;

    res = katherine_cmd_wait_ack(&device->control_socket);
    if (res) goto err;

    (void) katherine_udp_mutex_unlock(&device->control_socket);
    return 0;

err:
    (void) katherine_udp_mutex_unlock(&device->control_socket);
    return res;
}